

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
proto2_unittest::AggregateMessageSetElement::InternalSwap
          (AggregateMessageSetElement *this,AggregateMessageSetElement *other)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long __tmp;
  
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar5 = uVar2;
  if ((uVar2 & 1) != 0) {
    uVar5 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  uVar3 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar6 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar6 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  if (uVar5 == uVar6) {
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar3;
    (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar2;
    uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    pvVar4 = (other->field_0)._impl_.s_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.s_.tagged_ptr_.ptr_ = (this->field_0)._impl_.s_.tagged_ptr_.ptr_;
    (this->field_0)._impl_.s_.tagged_ptr_.ptr_ = pvVar4;
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }